

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ModulationType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ModulationType *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ModulationType *local_18;
  ModulationType *this_local;
  
  local_18 = this;
  this_local = (ModulationType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Modulation:\n");
  poVar1 = std::operator<<(poVar1,"\tSpread Spectrum:");
  poVar1 = std::operator<<(poVar1,"\n\t\tFrequency Hop:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(byte *)&this->field_0 & 1);
  poVar1 = std::operator<<(poVar1,"\n\t\tPsudo Noise:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(byte *)&this->field_0 >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\t\tTime Hop:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(byte *)&this->field_0 >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMajor Modulation Type:  ");
  ENUMS::GetEnumAsStringRadioMajorModulation_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16MajorModulationType,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"\n\tDetail:                 ");
  std::__cxx11::string::~string((string *)&local_1d0);
  switch(this->m_ui16MajorModulationType) {
  case 1:
    ENUMS::GetEnumAsStringDetailAmplitude_abi_cxx11_
              (&local_1f0,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    break;
  case 2:
    ENUMS::GetEnumAsStringDetailAmplitudeAndAngle_abi_cxx11_
              (&local_210,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    break;
  case 3:
    ENUMS::GetEnumAsStringDetailAngle_abi_cxx11_
              (&local_230,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    break;
  case 4:
    ENUMS::GetEnumAsStringDetailCombination_abi_cxx11_
              (&local_250,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    break;
  case 5:
    ENUMS::GetEnumAsStringDetailPulse_abi_cxx11_
              (&local_270,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    break;
  case 6:
    ENUMS::GetEnumAsStringDetailUnmodulated_abi_cxx11_
              (&local_290,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    break;
  case 7:
    ENUMS::GetEnumAsStringDetailCarrierPhaseShift_abi_cxx11_
              (&local_2b0,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::operator<<(local_190,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    break;
  default:
    std::ostream::operator<<(local_190,this->m_ui16Detail);
  }
  poVar1 = std::operator<<(local_190,"\n\tSystem:                 ");
  ENUMS::GetEnumAsStringModulationSystem_abi_cxx11_
            (&local_2d0,(ENUMS *)(ulong)this->m_ui16System,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ModulationType::GetAsString() const
{
    KStringStream ss;

    ss << "Modulation:\n"
       << "\tSpread Spectrum:"
       << "\n\t\tFrequency Hop:    "     << m_ui16FreqHop
       << "\n\t\tPsudo Noise:      "     << m_ui16PseudoNoise
       << "\n\t\tTime Hop:         "     << m_ui16TimeHop
       << "\n\tMajor Modulation Type:  " << GetEnumAsStringRadioMajorModulation( m_ui16MajorModulationType )
       << "\n\tDetail:                 ";

    switch( m_ui16MajorModulationType )
    {
    case Amplitude:
        ss << GetEnumAsStringDetailAmplitude( m_ui16Detail );
        break;

    case AmplitudeAndAngle:
        ss << GetEnumAsStringDetailAmplitudeAndAngle( m_ui16Detail );
        break;

    case Angle:
        ss << GetEnumAsStringDetailAngle( m_ui16Detail );
        break;

    case Combination:
        ss << GetEnumAsStringDetailCombination( m_ui16Detail );
        break;

    case Pulse:
        ss << GetEnumAsStringDetailPulse( m_ui16Detail );
        break;

    case Unmodulated:
        ss << GetEnumAsStringDetailUnmodulated( m_ui16Detail );
        break;

    case CarrierPhaseShiftModulation_CPSM:
        ss << GetEnumAsStringDetailCarrierPhaseShift( m_ui16Detail );
        break;

    default:
        ss << m_ui16Detail;
        break;
    }

    ss << "\n\tSystem:                 " << GetEnumAsStringModulationSystem( m_ui16System )
       << "\n";

    return ss.str();
}